

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void flush_before_commit_multi_writers_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle **ppfVar8;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  ulong uVar11;
  fdb_config *pfVar12;
  fdb_doc **ppfVar13;
  fdb_doc *pfVar14;
  char *ptr_handle;
  fdb_encryption_key *pfVar15;
  fdb_doc *pfVar16;
  long lVar17;
  fdb_file_handle **ptr_fhandle;
  char *pcVar18;
  fdb_doc **doc_00;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle **ppfVar20;
  char *handle;
  bool bVar21;
  fdb_doc *rdoc;
  fdb_kvs_handle *db1;
  fdb_kvs_handle *db2;
  fdb_file_handle *dbfile1;
  fdb_file_handle *dbfile2;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_1bfb8;
  fdb_file_handle *pfStack_1bfb0;
  void *pvStack_1bfa8;
  size_t asStack_1bfa0 [3];
  undefined4 uStack_1bf88;
  undefined4 uStack_1bf84;
  undefined4 uStack_1bf80;
  undefined4 uStack_1bf7c;
  undefined4 uStack_1bf78;
  fdb_kvs_config fStack_1bf70;
  timeval tStack_1bf58;
  fdb_config fStack_1bf48;
  char acStack_1be50 [256];
  char acStack_1bd50 [256];
  char acStack_1bc50 [264];
  fdb_config *pfStack_1bb48;
  fdb_kvs_handle **ppfStack_1bb40;
  fdb_kvs_handle *pfStack_1bb38;
  fdb_kvs_handle **ppfStack_1bb30;
  fdb_kvs_handle *pfStack_1bb28;
  code *pcStack_1bb20;
  fdb_kvs_handle *pfStack_1bb08;
  fdb_file_handle *pfStack_1bb00;
  fdb_kvs_handle *pfStack_1baf8;
  fdb_kvs_handle *pfStack_1baf0;
  fdb_kvs_config fStack_1bae8;
  timeval tStack_1bad0;
  fdb_config fStack_1bac0;
  fdb_kvs_handle *apfStack_1b9c8 [32];
  fdb_config fStack_1b8c8;
  fdb_kvs_handle **ppfStack_1b7c0;
  fdb_kvs_handle **ppfStack_1b7b8;
  fdb_kvs_handle **ppfStack_1b7b0;
  fdb_kvs_handle *pfStack_1b7a8;
  fdb_kvs_handle *pfStack_1b798;
  fdb_kvs_handle *pfStack_1b790;
  fdb_kvs_handle **ppfStack_1b788;
  fdb_kvs_handle *pfStack_1b780;
  fdb_kvs_config fStack_1b778;
  undefined1 auStack_1b760 [128];
  fdb_kvs_handle *apfStack_1b6e0 [33];
  fdb_config fStack_1b5d8;
  fdb_kvs_handle *apfStack_1b4e0 [32];
  fdb_kvs_handle *apfStack_1b3e0 [32];
  fdb_kvs_handle fStack_1b2e0;
  undefined8 auStack_1aee0 [896];
  fdb_kvs_handle *apfStack_192e0 [1025];
  fdb_doc **ppfStack_172d8;
  char *pcStack_172d0;
  long lStack_172c8;
  fdb_doc *pfStack_172c0;
  fdb_doc **ppfStack_172b8;
  fdb_doc *pfStack_172b0;
  fdb_doc *pfStack_17298;
  fdb_file_handle *pfStack_17290;
  long lStack_17288;
  fdb_kvs_handle *pfStack_17280;
  long lStack_17278;
  long lStack_17270;
  fdb_doc **ppfStack_17268;
  long lStack_17260;
  fdb_doc **ppfStack_17258;
  size_t sStack_17250;
  timeval tStack_17248;
  fdb_kvs_config fStack_17238;
  fdb_file_info fStack_17220;
  fdb_doc afStack_171d8 [3];
  char acStack_170d8 [264];
  fdb_config fStack_16fd0;
  char acStack_16ed8 [256];
  fdb_doc *apfStack_16dd8 [2999];
  size_t sStack_11020;
  size_t asStack_11018 [1023];
  undefined1 auStack_f019 [57225];
  fdb_doc **ppfStack_1090;
  fdb_config *pfStack_1088;
  fdb_file_handle **ppfStack_1080;
  ulong uStack_1078;
  fdb_kvs_handle **ppfStack_1070;
  fdb_kvs_handle **ppfStack_1068;
  fdb_doc *pfStack_1050;
  fdb_kvs_handle *pfStack_1048;
  undefined1 auStack_1040 [24];
  fdb_file_handle *pfStack_1028;
  fdb_kvs_handle *pfStack_1020;
  fdb_kvs_config fStack_1018;
  fdb_doc *apfStack_1000 [31];
  timeval tStack_f08;
  fdb_config fStack_ef8;
  char acStack_e00 [256];
  fdb_file_handle *apfStack_d00 [32];
  char acStack_c00 [264];
  fdb_kvs_handle **ppfStack_af8;
  char *pcStack_af0;
  char *pcStack_ae8;
  ulong uStack_ae0;
  undefined8 uStack_ad8;
  code *pcStack_ad0;
  fdb_file_handle *pfStack_ac8;
  fdb_kvs_handle *pfStack_ac0;
  char acStack_ab8 [32];
  fdb_kvs_config fStack_a98;
  timeval tStack_a80;
  fdb_file_info afStack_a70 [3];
  fdb_config fStack_978;
  fdb_config *pfStack_880;
  fdb_kvs_handle **ppfStack_878;
  fdb_kvs_handle *pfStack_870;
  fdb_doc *pfStack_868;
  fdb_kvs_handle *pfStack_860;
  fdb_encryption_key *pfStack_858;
  fdb_kvs_handle *pfStack_848;
  fdb_file_handle *pfStack_840;
  undefined1 auStack_838 [8];
  undefined1 auStack_830 [48];
  fdb_kvs_handle *apfStack_800 [32];
  fdb_doc afStack_700 [3];
  fdb_config fStack_600;
  ulong uStack_508;
  fdb_kvs_handle **ppfStack_500;
  fdb_kvs_handle *pfStack_4f8;
  fdb_doc *pfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  fdb_encryption_key *pfStack_4e0;
  fdb_doc *local_4d0;
  fdb_kvs_handle *local_4c8;
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  fdb_file_handle *local_4b0;
  fdb_doc *apfStack_4a8 [11];
  fdb_kvs_config local_450;
  timeval local_438;
  fdb_kvs_handle local_428;
  fdb_config local_128;
  
  pfStack_4e0 = (fdb_encryption_key *)0x11777e;
  gettimeofday(&local_438,(__timezone_ptr_t)0x0);
  pfStack_4e0 = (fdb_encryption_key *)0x117783;
  memleak_start();
  local_4d0 = (fdb_doc *)0x0;
  pfStack_4e0 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_4e0 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 8;
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  local_128.wal_flush_before_commit = true;
  pfStack_4e0 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_4e0 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&local_4b8,"dummy1",&local_128);
  pfStack_4e0 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(local_4b8,&local_4c8,(char *)0x0,&local_450);
  lVar17 = 0;
  uVar11 = 0;
  do {
    ppfVar8 = &local_428.bub_ctx.handle;
    pfStack_4e0 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar8,"key%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&local_428.config.encryption_key,"meta%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&local_428,"body%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x11785f;
    sVar5 = strlen((char *)ppfVar8);
    pfVar15 = &local_428.config.encryption_key;
    pfStack_4e0 = (fdb_encryption_key *)0x117872;
    sVar6 = strlen((char *)pfVar15);
    pfStack_4e0 = (fdb_encryption_key *)0x117882;
    sVar7 = strlen((char *)&local_428);
    pfStack_4e0 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_4a8 + lVar17),&local_428.bub_ctx.handle,sVar5,pfVar15
                   ,sVar6,&local_428,sVar7);
    pfStack_4e0 = (fdb_encryption_key *)0x1178b6;
    fdb_set(local_4c8,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar11 != 10);
  pfStack_4e0 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(local_4b8,'\x01');
  pfStack_4e0 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&local_4b0,"dummy1",&local_128);
  pfStack_4e0 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(local_4b0,&local_4c0,(char *)0x0,&local_450);
  pfVar15 = &local_428.config.encryption_key;
  lVar17 = 0;
  uVar11 = 0;
  do {
    pfStack_4e0 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar15,"meta2%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&local_428,"body2%d(db2)",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117956;
    sVar5 = strlen((char *)pfVar15);
    pfStack_4e0 = (fdb_encryption_key *)0x117961;
    sVar6 = strlen((char *)&local_428);
    pfStack_4e0 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_4a8 + lVar17),pfVar15,sVar5,&local_428,sVar6);
    pfStack_4e0 = (fdb_encryption_key *)0x117984;
    fdb_set(local_4c0,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar11 != 5);
  uVar11 = 5;
  lVar17 = 0x28;
  pfVar15 = &local_428.config.encryption_key;
  pfVar9 = &local_428;
  do {
    pfStack_4e0 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar15,"meta2%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar9,"body2%d(db1)",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x1179e5;
    sVar5 = strlen((char *)pfVar15);
    pfStack_4e0 = (fdb_encryption_key *)0x1179f0;
    sVar6 = strlen((char *)pfVar9);
    pfStack_4e0 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_4a8 + lVar17),pfVar15,sVar5,pfVar9,sVar6);
    pfStack_4e0 = (fdb_encryption_key *)0x117a1a;
    fdb_set(local_4c8,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar11 != 10);
  ppfVar8 = &local_428.bub_ctx.handle;
  pfVar15 = &local_428.config.encryption_key;
  uVar11 = 0;
  do {
    pcVar18 = "body2%d(db1)";
    pfStack_4e0 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar8,"key%d",uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar15,"meta2%d",uVar11);
    if ((uint)uVar11 < 5) {
      pcVar18 = "body2%d(db2)";
    }
    pfStack_4e0 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&local_428,pcVar18,uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117a8c;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117abb;
    fVar3 = fdb_get(local_4c8,local_4d0);
    pfVar16 = local_4d0;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_4e0 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_4e0 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar16 = (fdb_doc *)pcVar18;
LAB_00117dd3:
      pfStack_4e0 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_4e0 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_4e0 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117adb;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) {
      pfStack_4e0 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar18 = (char *)pfVar16;
      goto LAB_00117dc9;
    }
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117af6;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117dd3;
    pfStack_4e0 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar16);
    pcVar18 = (char *)0x0;
    local_4d0 = (fdb_doc *)0x0;
    pfStack_4e0 = (fdb_encryption_key *)0x117b16;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117b41;
    fVar3 = fdb_get(local_4c0,local_4d0);
    pfVar16 = local_4d0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117b61;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) goto LAB_00117df3;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117b7c;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117de3;
    pfStack_4e0 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar16);
    local_4d0 = (fdb_doc *)0x0;
    uVar10 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_4e0 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(local_4b8,'\0');
  pfStack_4e0 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(local_4b0,'\0');
  ppfVar8 = &local_428.bub_ctx.handle;
  pfVar15 = &local_428.config.encryption_key;
  uVar11 = 0;
  while( true ) {
    pfStack_4e0 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar8,"key%d",uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar15,"meta2%d",uVar11);
    pcVar18 = "body2%d(db1)";
    if ((uint)uVar11 < 5) {
      pcVar18 = "body2%d(db2)";
    }
    pfStack_4e0 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&local_428,pcVar18,uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117c28;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117c57;
    fVar3 = fdb_get(local_4c8,local_4d0);
    pfVar16 = local_4d0;
    pfVar14 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117c77;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) goto LAB_00117e03;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117c92;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117e1d;
    pfStack_4e0 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar16);
    pfVar14 = (fdb_doc *)0x0;
    local_4d0 = (fdb_doc *)0x0;
    pfStack_4e0 = (fdb_encryption_key *)0x117cb2;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117cdd;
    fVar3 = fdb_get(local_4c0,local_4d0);
    pfVar16 = local_4d0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117cfd;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) goto LAB_00117e3d;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117d18;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117e2d;
    pfStack_4e0 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar16);
    local_4d0 = (fdb_doc *)0x0;
    uVar10 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 10) {
      pfStack_4e0 = (fdb_encryption_key *)0x117d4d;
      fdb_close(local_4b8);
      pfStack_4e0 = (fdb_encryption_key *)0x117d57;
      fdb_close(local_4b0);
      lVar17 = 0;
      do {
        pfStack_4e0 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_4a8[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      pfStack_4e0 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_4e0 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_4e0 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar18,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_4e0 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_4e0 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar16 = pfVar14;
LAB_00117e1d:
  pfStack_4e0 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_4e0 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar19 = &local_428;
  ppfVar8 = &local_428.bub_ctx.handle;
  pfVar15 = &local_428.config.encryption_key;
  pfStack_4e0 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_858 = (fdb_encryption_key *)0x117e6a;
  uStack_508 = uVar11;
  ppfStack_500 = ppfVar8;
  pfStack_4f8 = pfVar9;
  pfStack_4f0 = pfVar16;
  pfStack_4e8 = pfVar19;
  pfStack_4e0 = pfVar15;
  gettimeofday((timeval *)(auStack_830 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_858 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_858 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_600;
  pfStack_858 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_858 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_600.buffercache_size = 0;
  fStack_600.wal_threshold = 0x1000;
  fStack_600.flags = 1;
  fStack_600.durability_opt = '\x02';
  fStack_600.auto_commit = true;
  pfStack_858 = (fdb_encryption_key *)0x117ec8;
  fVar3 = fdb_open(&pfStack_840,"dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_858 = (fdb_encryption_key *)0x117ee4;
    fVar3 = fdb_kvs_open_default(pfStack_840,&pfStack_848,(fdb_kvs_config *)(auStack_830 + 8));
    pcVar18 = (char *)pfVar19;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar18 = "body%d";
    pfVar15 = (fdb_encryption_key *)0x0;
    do {
      pfStack_858 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_700,"key%d",pfVar15);
      pfStack_858 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_800,"body%d",pfVar15);
      pfVar9 = pfStack_848;
      pfStack_858 = (fdb_encryption_key *)0x117f31;
      sVar5 = strlen((char *)afStack_700);
      pfVar12 = (fdb_config *)(sVar5 + 1);
      pfStack_858 = (fdb_encryption_key *)0x117f3d;
      sVar5 = strlen((char *)apfStack_800);
      pfStack_858 = (fdb_encryption_key *)0x117f52;
      fVar3 = fdb_set_kv(pfVar9,afStack_700,(size_t)pfVar12,apfStack_800,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_858 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar10 = (int)pfVar15 + 1;
      pfVar15 = (fdb_encryption_key *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfVar16 = afStack_700;
    ppfVar8 = apfStack_800;
    pfVar9 = (fdb_kvs_handle *)auStack_830;
    pfVar15 = (fdb_encryption_key *)auStack_838;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_858 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar16,"key%d",pfVar12);
      pfStack_858 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar8,"body%d",pfVar12);
      pfVar19 = pfStack_848;
      pfStack_858 = (fdb_encryption_key *)0x117fb0;
      sVar5 = strlen((char *)pfVar16);
      pfStack_858 = (fdb_encryption_key *)0x117fc5;
      fVar3 = fdb_get_kv(pfVar19,pfVar16,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar18 = (char *)auStack_830._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_858 = (fdb_encryption_key *)0x117fe2;
      iVar4 = bcmp((void *)auStack_830._0_8_,ppfVar8,(size_t)auStack_838);
      if (iVar4 != 0) goto LAB_00118159;
      pfStack_858 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar18);
      uVar10 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfStack_858 = (fdb_encryption_key *)0x118006;
    fVar3 = fdb_kvs_close(pfStack_848);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_858 = (fdb_encryption_key *)0x118018;
    fVar3 = fdb_close(pfStack_840);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_858 = (fdb_encryption_key *)0x118039;
    fVar3 = fdb_open(&pfStack_840,"dummy1",&fStack_600);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_858 = (fdb_encryption_key *)0x118055;
    fVar3 = fdb_kvs_open_default(pfStack_840,&pfStack_848,(fdb_kvs_config *)(auStack_830 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar16 = afStack_700;
    ppfVar8 = apfStack_800;
    pfVar9 = (fdb_kvs_handle *)auStack_830;
    pfVar15 = (fdb_encryption_key *)auStack_838;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_858 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar16,"key%d",pfVar12);
      pfStack_858 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar8,"body%d",pfVar12);
      pfVar19 = pfStack_848;
      pfStack_858 = (fdb_encryption_key *)0x1180a9;
      sVar5 = strlen((char *)pfVar16);
      pfStack_858 = (fdb_encryption_key *)0x1180be;
      fVar3 = fdb_get_kv(pfVar19,pfVar16,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar18 = (char *)auStack_830._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_858 = (fdb_encryption_key *)0x1180db;
      iVar4 = bcmp((void *)auStack_830._0_8_,ppfVar8,(size_t)auStack_838);
      if (iVar4 != 0) goto LAB_0011816b;
      pfStack_858 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar18);
      uVar10 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfStack_858 = (fdb_encryption_key *)0x1180ff;
    fVar3 = fdb_close(pfStack_840);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_858 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_858 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_858 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar18,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_858 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar18 = (char *)pfVar19;
LAB_00118182:
    pfStack_858 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_858 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_858 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_858 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_858 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_858 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_ad0 = (code *)0x1181bd;
  pfStack_880 = pfVar12;
  ppfStack_878 = ppfVar8;
  pfStack_870 = pfVar9;
  pfStack_868 = pfVar16;
  pfStack_860 = (fdb_kvs_handle *)pcVar18;
  pfStack_858 = pfVar15;
  gettimeofday(&tStack_a80,(__timezone_ptr_t)0x0);
  pcStack_ad0 = (code *)0x1181c2;
  memleak_start();
  pcStack_ad0 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_ad0 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_978.buffercache_size = 0;
  fStack_978.auto_commit = true;
  pcStack_ad0 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_ad0 = (code *)0x118207;
  memcpy(&fStack_978,afStack_a70,0xf8);
  pcStack_ad0 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar11 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_ab8 + 8,"est1",5);
    builtin_strncpy(acStack_ab8,"./func_t",8);
    pcStack_ad0 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_ac8,acStack_ab8,&fStack_978);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_ad0 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_ac8,&pfStack_ac0,"justonekv",&fStack_a98);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_ad0 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_ad0 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_ac8,afStack_a70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_a70[0].file_size != fStack_978.blocksize * 7) {
      pcStack_ad0 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_ad0 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_ac8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 0) {
      pcStack_ad0 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_ad0 = (code *)0x1182e9;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_ad0 = (code *)0x11831a;
      fprintf(_stderr,pcVar18,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_ad0 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_ad0 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_ad0 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_ad8 = 0x745f636e75662f2e;
  pcStack_ae8 = "justonekv";
  ppfStack_1068 = (fdb_kvs_handle **)0x118363;
  ppfStack_af8 = &pfStack_ac0;
  pcStack_af0 = acStack_ab8;
  uStack_ae0 = uVar11;
  pcStack_ad0 = (code *)&pfStack_ac8;
  gettimeofday(&tStack_f08,(__timezone_ptr_t)0x0);
  ppfStack_1068 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_1050 = (fdb_doc *)0x0;
  ppfStack_1068 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1068 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_1068 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_ef8.buffercache_size = 0;
  fStack_ef8.flags = 1;
  fStack_ef8.purging_interval = 0;
  fStack_ef8.compaction_threshold = '\0';
  ppfStack_1068 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_1040,"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
             &fStack_1018);
  ppfVar13 = apfStack_1000;
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_e00,"key%d",uVar11 & 0xffffffff);
    ppfStack_1068 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_c00,"meta%d",uVar11 & 0xffffffff);
    ptr_fhandle = apfStack_d00;
    ppfStack_1068 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar11 & 0xffffffff);
    ppfStack_1068 = (fdb_kvs_handle **)0x118462;
    ppfVar8 = (fdb_kvs_handle **)strlen(acStack_e00);
    ppfStack_1068 = (fdb_kvs_handle **)0x11846d;
    sVar5 = strlen(acStack_c00);
    ppfStack_1068 = (fdb_kvs_handle **)0x118478;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_1068 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar13,acStack_e00,(size_t)ppfVar8,acStack_c00,sVar5,ptr_fhandle,sVar6);
    uVar11 = uVar11 + 1;
    ppfVar13 = ppfVar13 + 1;
  } while (uVar11 != 0x1e);
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_1048,apfStack_1000[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  ppfStack_1068 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar12 = &fStack_ef8;
  ppfStack_1068 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_1040,"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
             &fStack_1018);
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11]->key,apfStack_1000[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if (uVar11 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_1068 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  ppfStack_1068 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_1048,apfStack_1000[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar12 = &fStack_ef8;
  ppfStack_1068 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_1040,"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
             &fStack_1018);
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11]->key,apfStack_1000[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if ((uVar11 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_1068 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_1068 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 6);
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_1048,apfStack_1000[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[lVar17 + 6]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_1028,"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_1028,&pfStack_1020,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_1028,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_1020,apfStack_1000[lVar17 + 8]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_1028,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_1028);
  ppfStack_1068 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11]->key,apfStack_1000[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if ((int)uVar11 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_1068 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 10);
  pfVar12 = (fdb_config *)auStack_1040;
  ppfStack_1068 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar12,"dummy1",&fStack_ef8);
  ptr_fhandle = &pfStack_1028;
  ppfStack_1068 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&fStack_ef8);
  ppfVar20 = (fdb_kvs_handle **)(auStack_1040 + 8);
  ppfStack_1068 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._0_8_,ppfVar20,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_1028,&pfStack_1020,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  ppfVar8 = &pfStack_1048;
  ppfStack_1068 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_1048,apfStack_1000[10]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_1048,apfStack_1000[0xb]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[0xc]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[0xd]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_1028,'\x02');
  ppfStack_1068 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_1020,apfStack_1000[0xe]);
  ppfStack_1068 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_1020,apfStack_1000[0xf]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_1048,apfStack_1000[0x10]);
  ppfStack_1068 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_1028,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_1048,apfStack_1000[0x11]);
  uVar11 = 0;
  ppfStack_1068 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\0');
  ppfStack_1068 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_1028);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,ppfVar8,&fStack_1018);
  while( true ) {
    ppfStack_1068 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11 + 10]->key,apfStack_1000[uVar11 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_1068 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
    if (uVar11 == 8) {
      ppfStack_1068 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_1040,"dummy1",&fStack_ef8);
      ppfStack_1068 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
                 &fStack_1018);
      ppfStack_1068 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
      ppfStack_1068 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[0x14]);
      ppfStack_1068 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_1040._16_8_,"dummy2");
      ppfStack_1068 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x01');
      ppfStack_1068 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_1040._16_8_);
      ppfStack_1068 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_1040._0_8_);
      lVar17 = 0;
      do {
        ppfStack_1068 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_1000[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x1e);
      ppfStack_1068 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_1068 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_1068 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar18,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_1068 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_1068 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_1068 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_1068 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_1068 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_172b0 = (fdb_doc *)0x118b77;
  ppfStack_1090 = &pfStack_1050;
  pfStack_1088 = pfVar12;
  ppfStack_1080 = ptr_fhandle;
  uStack_1078 = uVar11;
  ppfStack_1070 = ppfVar20;
  ppfStack_1068 = ppfVar8;
  gettimeofday(&tStack_17248,(__timezone_ptr_t)0x0);
  pfStack_172b0 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_17298 = (fdb_doc *)0x0;
  pfStack_172b0 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_172b0 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_172b0 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_16fd0.flags = 1;
  fStack_16fd0.purging_interval = 0;
  fStack_16fd0.compaction_threshold = '\0';
  fStack_16fd0.durability_opt = '\x02';
  pfStack_172b0 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_17290,"dummy1",&fStack_16fd0);
  pfStack_172b0 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_17290,&pfStack_17280,&fStack_17238);
  ppfVar13 = apfStack_16dd8;
  pfVar16 = afStack_171d8;
  pfVar14 = (fdb_doc *)0x0;
  lVar17 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar17 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar17 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_172b0 = (fdb_doc *)0x118c39;
    lStack_17278 = lVar17;
    memset(asStack_11018,0x5f,sVar5);
    *(undefined1 *)((long)asStack_11018 + sVar5) = 0;
    lVar17 = 0;
    doc_00 = ppfVar13;
    lStack_17270 = (long)pfVar14;
    ppfStack_17268 = ppfVar13;
    sStack_17250 = sVar5;
    do {
      pfStack_172b0 = (fdb_doc *)0x118c6f;
      lStack_17260 = lVar17;
      sprintf((char *)pfVar16,"%08d");
      asStack_11018[0] = afStack_171d8[0].keylen;
      uVar11 = 0;
      lStack_17288 = (long)pfVar14;
      ppfStack_17258 = doc_00;
      do {
        pfStack_172b0 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar16,"%08d",uVar11 & 0xffffffff);
        *(size_t *)((long)apfStack_16dd8 + sStack_17250 + 0x5db8) = afStack_171d8[0].keylen;
        uVar10 = (int)lStack_17288 + (int)uVar11;
        pfStack_172b0 = (fdb_doc *)0x118ce4;
        sprintf(acStack_16ed8,"meta%d",(ulong)uVar10);
        pfStack_172b0 = (fdb_doc *)0x118cf7;
        sprintf(acStack_170d8,"body%d",(ulong)uVar10);
        pfStack_172b0 = (fdb_doc *)0x118d04;
        sVar5 = strlen((char *)asStack_11018);
        pfStack_172b0 = (fdb_doc *)0x118d10;
        sVar6 = strlen(acStack_16ed8);
        pfStack_172b0 = (fdb_doc *)0x118d24;
        sVar7 = strlen(acStack_170d8);
        lVar1 = lStack_17288;
        pcVar18 = acStack_170d8;
        pfStack_172b0 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_11018,sVar5 + 1,acStack_16ed8,sVar6 + 1,pcVar18,sVar7 + 1);
        uVar11 = uVar11 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar11 != 10);
      lVar17 = lStack_17260 + 1;
      doc_00 = ppfStack_17258 + 10;
      pfVar14 = (fdb_doc *)(lVar1 + 10);
    } while (lVar17 != 100);
    lVar17 = lStack_17278 + 1;
    ppfVar13 = ppfStack_17268 + 1000;
    pfVar14 = (fdb_doc *)(lStack_17270 + 1000);
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    pfStack_172b0 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_17280,apfStack_16dd8[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3000);
  pfStack_172b0 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_17290,'\x01');
  pfStack_172b0 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_17290,&fStack_17220);
  if (fStack_17220.doc_count != 3000) {
    pfStack_172b0 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar17 = 0;
  while( true ) {
    pfStack_172b0 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_17298,apfStack_16dd8[lVar17]->key,apfStack_16dd8[lVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_172b0 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_17280,pfStack_17298);
    doc = pfStack_17298;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_17298->key;
    pfVar16 = apfStack_16dd8[lVar17];
    pcVar18 = (char *)pfVar16->key;
    pfStack_172b0 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar18,pfStack_17298->keylen);
    pfVar14 = doc;
    if (iVar4 != 0) {
      pfStack_172b0 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar18 = (char *)pfVar16->meta;
    pfStack_172b0 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar18,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar18 = (char *)pfVar16->body;
    pfStack_172b0 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar18,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_172b0 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_17298 = (fdb_doc *)0x0;
    lVar17 = lVar17 + 1;
    if (lVar17 == 3000) {
      pfStack_172b0 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_17290);
      lVar17 = 0;
      do {
        pfStack_172b0 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_16dd8[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3000);
      pfStack_172b0 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_172b0 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_172b0 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar18,"long key test");
      return;
    }
  }
  pfStack_172b0 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_172b0 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_172b0 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1b7a8 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_172d8 = &pfStack_17298;
  pcStack_172d0 = pcVar18;
  lStack_172c8 = lVar17;
  pfStack_172c0 = pfVar14;
  ppfStack_172b8 = doc_00;
  pfStack_172b0 = pfVar16;
  gettimeofday((timeval *)(auStack_1b760 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1b7a8 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1b7a8 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1b7a8 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1b7a8 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1b5d8.wal_threshold = 0x400;
  fStack_1b5d8.compaction_mode = '\0';
  fStack_1b5d8.durability_opt = '\x02';
  handle = (char *)&fStack_1b2e0;
  ppfVar20 = apfStack_1b4e0;
  pcVar18 = "kvs%d";
  uVar11 = 0;
  ppfVar8 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar20,"dummy%d",(ulong)ppfVar8 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1b6e0 + (long)ppfVar8 + -10);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar20,&fStack_1b5d8);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1b788 = ppfVar8;
    pfStack_1b780 = (fdb_kvs_handle *)handle;
    do {
      ppfVar8 = ppfVar2;
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar20,"kvs%d",(ulong)(uint)((int)ppfVar8 + (int)uVar11));
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)ppfVar20,&fStack_1b778);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1b7a8 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar8 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar8 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar8 = (fdb_kvs_handle **)((long)ppfStack_1b788 + 1);
    uVar11 = uVar11 + 0x80;
    handle = (char *)&pfStack_1b780[1].bub_ctx.space_used;
  } while (ppfVar8 != (fdb_kvs_handle **)0x8);
  ppfVar8 = apfStack_1b6e0;
  ppfVar20 = apfStack_1b3e0;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar11 = 0;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar8,"key%08d",uVar11);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar20,"value%08d",uVar11);
      pcVar18 = *(char **)(&fStack_1b2e0.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1190e0;
      sVar5 = strlen((char *)ppfVar8);
      ptr_handle = (char *)(sVar5 + 1);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1190ec;
      sVar5 = strlen((char *)ppfVar20);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar18,ppfVar8,(size_t)ptr_handle,ppfVar20,sVar5 + 1);
      handle = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b6e0[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b6e0[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar20 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_192e0;
  ppfVar8 = (fdb_kvs_handle **)(auStack_1b760 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1b760;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1aee0[(long)ppfVar20],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1b760._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1aee0[(long)ppfVar20],
                              (fdb_kvs_handle **)ptr_handle,auStack_1b760._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar20 = ppfVar20 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar20 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1b6e0[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1b790;
  pfStack_1b790 = (fdb_kvs_handle *)0x0;
  ppfVar8 = &pfStack_1b798;
  handle = "key%08d";
  ppfVar20 = apfStack_1b6e0;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_192e0[(long)pfVar9],(fdb_iterator **)ppfVar8,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar11 = 0;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1b798,(fdb_doc **)ptr_handle);
      pcVar18 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar20,"key%08d",uVar11);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar20,(char *)pfStack_1b790->op_stats);
      if (iVar4 != 0) {
        pfStack_1b7a8 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1b798);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1b798);
    pcVar18 = (char *)&(pfVar9->config).wal_threshold;
    bVar21 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar18;
  } while (bVar21);
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1b790);
  ptr_handle = "key%08d";
  ppfVar8 = apfStack_1b6e0;
  ppfVar20 = (fdb_kvs_handle **)0x0;
  do {
    uVar11 = 0;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar8,"key%08d",uVar11);
      handle = *(char **)(&fStack_1b2e0.kvs_config.create_if_missing + (long)ppfVar20 * 8);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1192dd;
      sVar5 = strlen((char *)ppfVar8);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ppfVar8,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10);
    ppfVar20 = (fdb_kvs_handle **)((long)ppfVar20 + 1);
  } while (ppfVar20 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar8 = apfStack_1b4e0;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar8,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1b6e0[(long)((long)&pfVar9[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1b790;
  pfStack_1b790 = (fdb_kvs_handle *)0x0;
  ppfVar8 = &pfStack_1b798;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1b2e0.kvs_config.create_if_missing + (long)handle * 8),
                              (fdb_iterator **)ppfVar8,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1b798,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1b798);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1b798);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar21 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar9;
  } while (bVar21);
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1b790);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1b6e0[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar18,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1b7a8 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1bb20 = (code *)0x119494;
  ppfStack_1b7c0 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1b7b8 = ppfVar20;
  ppfStack_1b7b0 = ppfVar8;
  pfStack_1b7a8 = pfVar9;
  gettimeofday(&tStack_1bad0,(__timezone_ptr_t)0x0);
  pcStack_1bb20 = (code *)0x119499;
  memleak_start();
  pcStack_1bb20 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_1bac0;
  pcStack_1bb20 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1bb20 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1bb20 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1bb00,"./dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1bb20 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1bb00,&pfStack_1baf8,"db",&fStack_1bae8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1bb20 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1bb00,&pfStack_1baf0,"db2",&fStack_1bae8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar12 = &fStack_1b8c8;
    pcStack_1bb20 = (code *)0x119539;
    sprintf((char *)pfVar12,"key%d",0);
    ppfVar8 = apfStack_1b9c8;
    pcStack_1bb20 = (code *)0x119554;
    sprintf((char *)ppfVar8,"body%d",0);
    pcStack_1bb20 = (code *)0x11955c;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar12);
    pcStack_1bb20 = (code *)0x119567;
    sVar5 = strlen((char *)ppfVar8);
    ppfVar20 = &pfStack_1bb08;
    pcStack_1bb20 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar20,pfVar12,(size_t)pfVar9,(void *)0x0,0,ppfVar8,sVar5 + 1);
    pcStack_1bb20 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1baf8,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1bb20 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1bb00,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1bb20 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1bb08->field_6).seqtree,"bOdy%d",0);
    pcStack_1bb20 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1baf0,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1bb20 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1bb00,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1bb20 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1baf8,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1bb20 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1baf0,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1bb20 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1baf8,(fdb_doc *)pfStack_1bb08);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1bb20 = (code *)0x11964d;
      fdb_close(pfStack_1bb00);
      pcStack_1bb20 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1bb08);
      pcStack_1bb20 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1bb20 = (code *)0x119661;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_1bb20 = (code *)0x119692;
      fprintf(_stderr,pcVar18,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1bb20 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1bb20 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1bb20 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1bb20 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1bb20 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1bb20 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1bb20 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1bb20 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1bb20 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1bb20 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1bb48 = pfVar12;
  ppfStack_1bb40 = ppfVar20;
  pfStack_1bb38 = (fdb_kvs_handle *)pcVar18;
  ppfStack_1bb30 = ppfVar8;
  pfStack_1bb28 = pfVar9;
  pcStack_1bb20 = (code *)uVar11;
  gettimeofday(&tStack_1bf58,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1bf48.wal_threshold = 0x400;
  fStack_1bf48.flags = 1;
  fStack_1bf48.purging_interval = 0;
  fStack_1bf48.compaction_threshold = '\0';
  fStack_1bf48.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1bf48.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1bfb0,"./dummy1",&fStack_1bf48);
  fdb_kvs_open_default(pfStack_1bfb0,&pfStack_1bfb8,&fStack_1bf70);
  fVar3 = fdb_set_log_callback(pfStack_1bfb8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1bfb8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar11 = 0;
    do {
      sprintf(acStack_1bd50,"key%d",uVar11);
      sprintf(acStack_1bc50,"body%d",uVar11);
      pfVar9 = pfStack_1bfb8;
      sVar5 = strlen(acStack_1bd50);
      sVar6 = strlen(acStack_1bc50);
      fVar3 = fdb_set_kv(pfVar9,acStack_1bd50,sVar5,acStack_1bc50,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10);
    asStack_1bfa0[1] = 0x726162ffffffff;
    asStack_1bfa0[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1bf88 = 0xbdbdbdbd;
    uStack_1bf84 = 0xbdbdbdbd;
    uStack_1bf80 = 0xbdbdbdbd;
    uStack_1bf7c = 0xbdbdbdbd;
    uStack_1bf78 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1bfb0,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1bfb8);
    fdb_close(pfStack_1bfb0);
    fStack_1bf48.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1bf48.encryption_key.bytes,"bar",4);
    fStack_1bf48.encryption_key.bytes[4] = 0xbd;
    fStack_1bf48.encryption_key.bytes[5] = 0xbd;
    fStack_1bf48.encryption_key.bytes[6] = 0xbd;
    fStack_1bf48.encryption_key.bytes[7] = 0xbd;
    fStack_1bf48.encryption_key.bytes[8] = 0xbd;
    fStack_1bf48.encryption_key.bytes[9] = 0xbd;
    fStack_1bf48.encryption_key.bytes[10] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xb] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xc] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xd] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xe] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xf] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x10] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x11] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x12] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x13] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x14] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x15] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x16] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x17] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x18] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x19] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1bfb0,"./dummy1",&fStack_1bf48);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1bfb0,&pfStack_1bfb8,&fStack_1bf70);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1bfb8,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar11 = 0;
      while( true ) {
        sprintf(acStack_1bd50,"key%d",uVar11);
        pfVar9 = pfStack_1bfb8;
        sVar5 = strlen(acStack_1bd50);
        fVar3 = fdb_get_kv(pfVar9,acStack_1bd50,sVar5,&pvStack_1bfa8,asStack_1bfa0);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1be50,"body%d",uVar11);
        ptr = pvStack_1bfa8;
        iVar4 = bcmp(pvStack_1bfa8,acStack_1be50,asStack_1bfa0[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
        if (uVar10 == 10) {
          fdb_kvs_close(pfStack_1bfb8);
          fdb_close(pfStack_1bfb0);
          fdb_shutdown();
          memleak_end();
          pcVar18 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar18 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar18,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
LAB_00117e03:
  pfStack_4e0 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar14 = pfVar16;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_858 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar18;
LAB_00118166:
  pcVar18 = (char *)pfVar19;
  pfStack_858 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_858 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar18;
LAB_00118178:
  pfVar16 = afStack_700;
  ppfVar8 = apfStack_800;
  pfStack_858 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)handle;
LAB_00119452:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
}

Assistant:

void flush_before_commit_multi_writers_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile1, *dbfile2;
    fdb_kvs_handle *db1, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 8;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    kvs_config = fdb_get_default_kvs_config();

    // open db
    fdb_open(&dbfile1, "dummy1", &fconfig);
    fdb_kvs_open(dbfile1, &db1, NULL, &kvs_config);

    // create & insert docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open second writer
    fdb_open(&dbfile2, "dummy1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);

    for (i=0;i<n/2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db2)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc[i]);
    }
    for (i=n/2;i<n;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db1)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }

    // retrieve before commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_commit(dbfile1, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);

    // retrieve after commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_close(dbfile1);
    fdb_close(dbfile2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit with multi writers test");
}